

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_sdm_mips64el(CPUMIPSState_conflict5 *env,target_ulong addr,target_ulong reglist,
                        uint32_t mem_idx)

{
  uint uVar1;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  
  uVar1 = (uint)reglist & 0xf;
  if ((ulong)uVar1 - 1 < 9) {
    uVar2 = 0;
    do {
      cpu_stq_mmuidx_ra_mips64el
                ((CPUArchState_conflict14 *)env,addr,
                 (env->active_tc).gpr[*(int *)((long)multiple_regs + uVar2)],mem_idx,unaff_retaddr);
      addr = addr + 8;
      uVar2 = uVar2 + 4;
    } while (uVar1 << 2 != uVar2);
  }
  if ((reglist & 0x10) == 0) {
    return;
  }
  cpu_stq_mmuidx_ra_mips64el
            ((CPUArchState_conflict14 *)env,addr,(env->active_tc).gpr[0x1f],mem_idx,unaff_retaddr);
  return;
}

Assistant:

void helper_sdm(CPUMIPSState *env, target_ulong addr, target_ulong reglist,
                uint32_t mem_idx)
{
    target_ulong base_reglist = reglist & 0xf;
    target_ulong do_r31 = reglist & 0x10;

    if (base_reglist > 0 && base_reglist <= ARRAY_SIZE(multiple_regs)) {
        target_ulong i;

        for (i = 0; i < base_reglist; i++) {
            cpu_stq_mmuidx_ra(env, addr, env->active_tc.gpr[multiple_regs[i]],
                              mem_idx, GETPC());
            addr += 8;
        }
    }

    if (do_r31) {
        cpu_stq_mmuidx_ra(env, addr, env->active_tc.gpr[31], mem_idx, GETPC());
    }
}